

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctkern__cl_parse(fctkern_t *nk)

{
  fct_clp_t *clp_00;
  undefined8 uVar1;
  undefined8 uVar2;
  char **ppcVar3;
  size_t sVar4;
  fctcl_t *clo;
  undefined8 *puVar5;
  long *plVar6;
  long lVar7;
  bool bVar8;
  FILE *__stream;
  int iVar9;
  int iVar10;
  char *__s;
  char *option;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  fct_logger_i *itm;
  char *buffer_len;
  long lVar14;
  int iVar15;
  ulong uVar16;
  fct_clp_t *clp;
  char *err;
  undefined1 local_48 [16];
  
  if (nk == (fctkern_t *)0x0) {
    return 0;
  }
  if ((nk->cl_user_opts != (fctcl_init_t *)0x0) &&
     (iVar9 = fct_clp__add_options(&nk->cl_parser,nk->cl_user_opts), iVar9 == 0)) {
    return 0;
  }
  clp_00 = &nk->cl_parser;
  iVar9 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
  if (iVar9 == 0) {
    return 0;
  }
  iVar9 = nk->cl_argc;
  ppcVar3 = nk->cl_argv;
  (nk->cl_parser).error_msg[0] = '\0';
  (nk->cl_parser).is_error = 0;
  if (1 < iVar9) {
    pcVar13 = (nk->cl_parser).error_msg;
    iVar15 = 1;
LAB_001024d8:
    __s = fctstr_clone(ppcVar3[iVar15]);
    option = strtok(__s,"=");
    pcVar11 = strtok((char *)0x0,"=");
    sVar4 = (nk->cl_parser).clo_list.used_itm_num;
    bVar8 = true;
    if (sVar4 != 0) {
      uVar16 = 0;
      while( true ) {
        if ((nk->cl_parser).clo_list.used_itm_num <= uVar16) goto LAB_00102912;
        clo = (fctcl_t *)(clp_00->clo_list).itm_list[uVar16];
        buffer_len = option;
        iVar10 = fctcl__is_option(clo,option);
        if (iVar10 != 0) break;
        uVar16 = uVar16 + 1;
        if (sVar4 == uVar16) goto code_r0x00102554;
      }
      if (clo->action == FCTCL_STORE_TRUE) {
        pcVar11 = "1";
      }
      else {
        if (clo->action != FCTCL_STORE_VALUE) goto LAB_001025a8;
        if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) goto LAB_0010259e;
        iVar15 = iVar15 + 1;
        if (iVar9 <= iVar15) {
          fct_snprintf(pcVar13,(size_t)buffer_len,"missing argument for %s",option);
          (nk->cl_parser).is_error = 1;
          goto LAB_001028ee;
        }
        pcVar11 = ppcVar3[iVar15];
      }
LAB_0010259e:
      pcVar11 = fctstr_clone(pcVar11);
      clo->value = pcVar11;
LAB_001025a8:
      bVar8 = false;
    }
    goto LAB_001025af;
  }
LAB_001025f7:
  sVar4 = (nk->cl_parser).param_list.used_itm_num;
  if (sVar4 != 0) {
    uVar16 = 0;
    do {
      if ((nk->cl_parser).param_list.used_itm_num <= uVar16) goto LAB_00102912;
      pcVar13 = (char *)(nk->cl_parser).param_list.itm_list[uVar16];
      if (pcVar13 == (char *)0x0) {
        __assert_fail("prefix_filter != __null && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      sVar12 = strlen(pcVar13);
      if (sVar12 == 0) {
        __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      pcVar11 = (char *)malloc(sVar12 + 1);
      fctstr_safe_cpy(pcVar11,pcVar13,sVar12 + 1);
      fct_nlist__append(&nk->prefix_list,pcVar11);
      uVar16 = uVar16 + 1;
    } while (sVar4 != uVar16);
  }
  pcVar13 = fct_clp__optval2(clp_00,"--version",(char *)0x0);
  if (pcVar13 == (char *)0x0) {
    pcVar13 = fct_clp__optval2(clp_00,"--help",(char *)0x0);
    __stream = _stdout;
    if (pcVar13 == (char *)0x0) {
      pcVar13 = fct_clp__optval2(clp_00,"--logger","standard");
      if (pcVar13 == (char *)0x0) {
        __assert_fail("sel_logger != __null && \"should never be NULL\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
      }
      if (nk->lt_usr == (fct_logger_types_t *)0x0) {
        itm = (fct_logger_i *)0x0;
      }
      else {
        itm = fckern_sel_log(nk->lt_usr,pcVar13);
      }
      if (itm == (fct_logger_i *)0x0 && nk->lt_sys != (fct_logger_types_t *)0x0) {
        itm = fckern_sel_log(nk->lt_sys,pcVar13);
      }
      if (itm != (fct_logger_i *)0x0) {
        fct_nlist__append(&nk->logger_list,itm);
        nk->cl_is_parsed = 1;
        return 1;
      }
      fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar13);
    }
    else {
      fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
      sVar4 = (nk->cl_parser).clo_list.used_itm_num;
      if (sVar4 != 0) {
        uVar16 = 0;
        do {
          if ((nk->cl_parser).clo_list.used_itm_num <= uVar16) {
LAB_00102912:
            __assert_fail("idx < list->used_itm_num",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
          }
          puVar5 = (undefined8 *)(clp_00->clo_list).itm_list[uVar16];
          if (puVar5[1] == 0) {
            fprintf(__stream,"%s\n",*puVar5);
          }
          else {
            fprintf(__stream,"%s, %s\n");
          }
          iVar9 = fctstr_ieq((char *)*puVar5,"--logger");
          if (iVar9 == 0) {
            fprintf(__stream,"  %s\n",puVar5[3]);
          }
          else {
            uVar1 = nk->lt_usr;
            uVar2 = nk->lt_sys;
            local_48._8_4_ = (int)uVar1;
            local_48._0_8_ = uVar2;
            local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
            fputs("  Sets the logger. The types of loggers currently available are,\n",__stream);
            lVar14 = 0;
            do {
              plVar6 = *(long **)(local_48 + lVar14 * 8);
              if (plVar6 != (long *)0x0) {
                lVar7 = *plVar6;
                while (lVar7 != 0) {
                  fprintf(__stream,"   =%s : %s\n",lVar7,plVar6[2]);
                  lVar7 = plVar6[3];
                  plVar6 = plVar6 + 3;
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != 2);
            fprintf(__stream,"  default is \'%s\'.\n","standard");
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != sVar4);
      }
      fputs("\n",__stream);
    }
  }
  else {
    printf("Built using FCTX version %s.\n","1.6.1");
  }
  return -1;
code_r0x00102554:
  bVar8 = true;
LAB_001025af:
  if ((nk->cl_parser).is_error != 0) goto LAB_001028ee;
  if (bVar8) {
    fct_nlist__append(&(nk->cl_parser).param_list,__s);
  }
  else if (__s != (char *)0x0) {
    free(__s);
  }
  iVar15 = iVar15 + 1;
  if (iVar9 <= iVar15) goto code_r0x001025ea;
  goto LAB_001024d8;
code_r0x001025ea:
  if ((nk->cl_parser).is_error != 0) {
LAB_001028ee:
    fprintf(_stderr,"error: %s",pcVar13);
    return 0;
  }
  goto LAB_001025f7;
}

Assistant:

static int
fctkern__cl_parse(fctkern_t *nk)
{
    int status =0;
    size_t num_params =0;
    size_t param_i =0;
    if ( nk == NULL )
    {
        return 0;
    }
    if ( nk->cl_user_opts != NULL )
    {
        if ( !fct_clp__add_options(&(nk->cl_parser), nk->cl_user_opts) )
        {
            status =0;
            goto finally;
        }
    }
    /* You want to add the "house options" after the user defined ones. The
    options are stored as a list so it means that any option listed after
    the above ones won't get parsed. */
    if ( !fct_clp__add_options(&(nk->cl_parser), FCT_CLP_OPTIONS) )
    {
        status =0;
        goto finally;
    }
    fct_clp__parse(&(nk->cl_parser), nk->cl_argc, nk->cl_argv);
    if ( fct_clp__is_error(&(nk->cl_parser)) )
    {
        char *err = fct_clp__get_error(&(nk->cl_parser));
        fprintf(stderr, "error: %s", err);
        status =0;
        goto finally;
    }
    num_params = fct_clp__param_cnt(&(nk->cl_parser));
    for ( param_i =0; param_i != num_params; ++param_i )
    {
        char const *param = fct_clp__param_at(&(nk->cl_parser), param_i);
        fctkern__add_prefix_filter(nk, param);
    }
    if ( fctkern__cl_is(nk, FCT_OPT_VERSION) )
    {
        (void)printf("Built using FCTX version %s.\n", FCT_VERSION_STR);
        status = -1;
        goto finally;
    }
    if ( fctkern__cl_is(nk, FCT_OPT_HELP) )
    {
        fctkern__write_help(nk, stdout);
        status = -1;
        goto finally;
    }
    if ( !fctkern__cl_parse_config_logger(nk) )
    {
        status = -1;
        goto finally;
    }
    status =1;
    nk->cl_is_parsed =1;
finally:
    return status;
}